

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

void __thiscall
Wasm::PolymorphicEmitInfo::Init(PolymorphicEmitInfo *this,uint32 count,ArenaAllocator *alloc)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  EmitInfo *pEVar5;
  EmitInfo *pEVar6;
  
  (this->field_1).infos = (EmitInfo *)0x0;
  if (1 < count) {
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00f22a17;
      *puVar4 = 0;
    }
    pEVar5 = (EmitInfo *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             AllocInternal(&alloc->
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                           ,(ulong)count * 8);
    if (pEVar5 == (EmitInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00f22a17:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    pEVar6 = pEVar5;
    do {
      pEVar6->super_EmitInfoBase = 0xffffffff;
      pEVar6->type = Void;
      pEVar6 = pEVar6 + 1;
    } while (pEVar6 != pEVar5 + count);
    (this->field_1).infos = pEVar5;
  }
  this->count = count;
  return;
}

Assistant:

void PolymorphicEmitInfo::Init(uint32 count, ArenaAllocator* alloc)
{
    infos = nullptr;
    if (count > 1)
    {
        infos = AnewArray(alloc, EmitInfo, count);
    }
    this->count = count;
}